

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop_time.c
# Opt level: O1

void init_stop_time(stop_time_t *record)

{
  record->trip_id[0] = '\0';
  record->arrival_time[0] = '\0';
  record->departure_time[0] = '\0';
  record->stop_id[0] = '\0';
  record->stop_sequence = 0;
  record->stop_headsign[0] = '\0';
  record->pickup_type = ST_REGULAR;
  record->dropoff_type = ST_REGULAR;
  record->shape_dist_traveled = 0.0;
  record->timepoint = TP_EXACT;
  return;
}

Assistant:

void init_stop_time(stop_time_t *record) {
    strcpy(record->trip_id, "");
    strcpy(record->arrival_time, "");
    strcpy(record->departure_time, "");
    strcpy(record->stop_id, "");
    record->stop_sequence = 0;
    strcpy(record->stop_headsign, "");
    record->pickup_type = ST_REGULAR;
    record->dropoff_type = ST_REGULAR;
    record->shape_dist_traveled = 0.0;
    record->timepoint = TP_EXACT;
}